

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_resize_clear(mbedtls_mpi *X,size_t limbs)

{
  size_t limbs_local;
  mbedtls_mpi *X_local;
  
  if (limbs == 0) {
    mbedtls_mpi_free(X);
    X_local._4_4_ = 0;
  }
  else if (X->n == limbs) {
    memset(X->p,0,limbs << 3);
    X->s = 1;
    X_local._4_4_ = 0;
  }
  else {
    mbedtls_mpi_free(X);
    X_local._4_4_ = mbedtls_mpi_grow(X,limbs);
  }
  return X_local._4_4_;
}

Assistant:

static int mbedtls_mpi_resize_clear(mbedtls_mpi *X, size_t limbs)
{
    if (limbs == 0) {
        mbedtls_mpi_free(X);
        return 0;
    } else if (X->n == limbs) {
        memset(X->p, 0, limbs * ciL);
        X->s = 1;
        return 0;
    } else {
        mbedtls_mpi_free(X);
        return mbedtls_mpi_grow(X, limbs);
    }
}